

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall
HashCallback<Blob<256>_>::operator()(HashCallback<Blob<256>_> *this,void *key,int len)

{
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *this_00;
  pointer pBVar1;
  size_t i;
  long lVar2;
  Blob<256> h;
  uint8_t local_48 [40];
  
  this_00 = this->m_hashes;
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::resize
            (this_00,((long)(this_00->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  lVar2 = 0;
  (*this->m_pfHash)(key,len,0,local_48);
  pBVar1 = (this->m_hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pBVar1[-1].bytes[lVar2] = local_48[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }